

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall
duckdb_re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  int iVar1;
  undefined8 *puVar2;
  bool bVar3;
  unsigned_long *puVar4;
  char **ppcVar5;
  Job *pJVar6;
  size_type sVar7;
  bool bVar8;
  long lVar9;
  Prog *pPVar10;
  unsigned_long *__s;
  char **__s_00;
  Job *pJVar11;
  char *pcVar12;
  int iVar13;
  _Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter> _Var14;
  long lVar15;
  char *pcVar16;
  size_type __n;
  char *p0;
  new_allocator<unsigned_long> local_22;
  new_allocator<const_char_*> local_21;
  
  sVar7 = text->size_;
  (this->text_).data_ = text->data_;
  (this->text_).size_ = sVar7;
  sVar7 = context->size_;
  (this->context_).data_ = context->data_;
  (this->context_).size_ = sVar7;
  if ((this->context_).data_ == (const_pointer)0x0) {
    sVar7 = text->size_;
    (this->context_).data_ = text->data_;
    (this->context_).size_ = sVar7;
  }
  pPVar10 = this->prog_;
  bVar8 = pPVar10->anchor_start_;
  if (((bVar8 != true) || ((this->context_).data_ == text->data_)) &&
     ((bVar3 = pPVar10->anchor_end_, bVar3 != true ||
      ((this->context_).data_ + (this->context_).size_ == text->data_ + text->size_)))) {
    if (anchored) {
      bVar8 = true;
    }
    this->anchored_ = bVar8;
    bVar8 = bVar3;
    if (longest) {
      bVar8 = true;
    }
    this->longest_ = bVar8;
    this->endmatch_ = bVar3;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (0 < nsubmatch) {
      lVar9 = 0;
      lVar15 = 0;
      do {
        puVar2 = (undefined8 *)((long)&this->submatch_->data_ + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar15 = lVar15 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar15 < this->nsubmatch_);
      pPVar10 = this->prog_;
    }
    iVar13 = ((int)text->size_ + 1) * pPVar10->list_count_;
    iVar1 = iVar13 + 0x3f;
    iVar13 = iVar13 + 0x7e;
    if (-1 < iVar1) {
      iVar13 = iVar1;
    }
    _Var14.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false>._M_head_impl.
    len_ = (_Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false>)(iVar13 >> 6);
    __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                    (&local_22,
                     (long)(int)_Var14.
                                super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false>
                                ._M_head_impl.len_,(void *)0x0);
    puVar4 = (this->visited_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t
             .super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (this->visited_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __s;
    if (puVar4 != (unsigned_long *)0x0) {
      operator_delete(puVar4);
      __s = (this->visited_).ptr_._M_t.
            super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    (this->visited_).ptr_._M_t.
    super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
    super__Tuple_impl<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
    super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false> =
         _Var14.super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false>.
         _M_head_impl.len_;
    switchD_012e3010::default
              (__s,0,(long)(int)_Var14.
                                super__Head_base<1UL,_duckdb_re2::PODArray<unsigned_long>::Deleter,_false>
                                ._M_head_impl.len_ << 3);
    __n = 2;
    if (2 < nsubmatch * 2) {
      __n = (size_type)(uint)(nsubmatch * 2);
    }
    __s_00 = __gnu_cxx::new_allocator<const_char_*>::allocate(&local_21,__n,(void *)0x0);
    ppcVar5 = (this->cap_).ptr_._M_t.
              super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
              super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
              super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    (this->cap_).ptr_._M_t.
    super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
    super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl = __s_00;
    if (ppcVar5 != (char **)0x0) {
      operator_delete(ppcVar5);
      __s_00 = (this->cap_).ptr_._M_t.
               super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t
               .super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
    }
    (this->cap_).ptr_._M_t.
    super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
    super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
    super__Tuple_impl<1UL,_duckdb_re2::PODArray<const_char_*>::Deleter>.
    super__Head_base<1UL,_duckdb_re2::PODArray<const_char_*>::Deleter,_false> =
         (Deleter)SUB84(__n,0);
    switchD_012e3010::default(__s_00,0,__n * 8);
    pJVar11 = (Job *)operator_new(0x400);
    pJVar6 = (this->job_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
    (this->job_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
    super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl = pJVar11;
    if (pJVar6 != (Job *)0x0) {
      operator_delete(pJVar6);
    }
    (this->job_).ptr_._M_t.
    super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>._M_t.
    super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
    super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false> =
         (_Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false>)0x40;
    p0 = text->data_;
    if (this->anchored_ != false) {
      *(this->cap_).ptr_._M_t.
       super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl = p0;
      bVar8 = TrySearch(this,this->prog_->start_,p0);
      return bVar8;
    }
    if (-1 < (long)text->size_) {
      pcVar16 = p0 + text->size_;
      do {
        if (((p0 < pcVar16) && (this->prog_->prefix_size_ != 0)) &&
           (pcVar12 = (char *)Prog::PrefixAccel(this->prog_,p0,(long)pcVar16 - (long)p0),
           p0 = pcVar16, pcVar12 != (char *)0x0)) {
          p0 = pcVar12;
        }
        *(this->cap_).ptr_._M_t.
         super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
         super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
         super__Head_base<0UL,_const_char_**,_false>._M_head_impl = p0;
        bVar8 = TrySearch(this,this->prog_->start_,p0);
        if (bVar8) {
          return bVar8;
        }
        if (p0 == (char *)0x0) {
          return bVar8;
        }
        p0 = p0 + 1;
      } while (p0 <= pcVar16);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.data() == NULL)
    context_ = text;
  if (prog_->anchor_start() && BeginPtr(context_) != BeginPtr(text))
    return false;
  if (prog_->anchor_end() && EndPtr(context_) != EndPtr(text))
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = StringPiece();

  // Allocate scratch space.
  int nvisited = prog_->list_count() * static_cast<int>(text.size()+1);
  nvisited = (nvisited + kVisitedBits-1) / kVisitedBits;
  visited_ = PODArray<uint64_t>(nvisited);
  memset(visited_.data(), 0, nvisited*sizeof visited_[0]);

  int ncap = 2*nsubmatch;
  if (ncap < 2)
    ncap = 2;
  cap_ = PODArray<const char*>(ncap);
  memset(cap_.data(), 0, ncap*sizeof cap_[0]);

  // When sizeof(Job) == 16, we start with a nice round 1KiB. :)
  job_ = PODArray<Job>(64);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.data();
    return TrySearch(prog_->start(), text.data());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  const char* etext = text.data() + text.size();
  for (const char* p = text.data(); p <= etext; p++) {
    // Try to use prefix accel (e.g. memchr) to skip ahead.
    if (p < etext && prog_->can_prefix_accel()) {
      p = reinterpret_cast<const char*>(prog_->PrefixAccel(p, etext - p));
      if (p == NULL)
        p = etext;
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
    // Avoid invoking undefined behavior (arithmetic on a null pointer)
    // by simply not continuing the loop.
    if (p == NULL)
      break;
  }
  return false;
}